

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_ror_16_s(void)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = (char)(m68ki_cpu.ir >> 9) - 1U & 7;
  uVar2 = m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xffff;
  m68ki_cpu.not_z_flag =
       m68ki_cpu.dar[m68ki_cpu.ir & 7] << (bVar1 ^ 0xf) & 0xffff | uVar2 >> bVar1 + 1;
  *(short *)(m68ki_cpu.dar + (m68ki_cpu.ir & 7)) = (short)m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 8;
  m68ki_cpu.c_flag = uVar2 << (8 - bVar1 & 0x1f);
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_ror_16_s(void)
{
	uint* r_dst = &DY;
	uint shift = (((REG_IR >> 9) - 1) & 7) + 1;
	uint src = MASK_OUT_ABOVE_16(*r_dst);
	uint res = ROR_16(src, shift);

    /*
	if(shift != 0)
		USE_CYCLES(shift<<CYC_SHIFT);
    */

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | res;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_C = src << (9-shift);
	FLAG_V = VFLAG_CLEAR;
}